

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlinsolx1.c
# Opt level: O1

int main(int argc,char **argv)

{
  int_t iVar1;
  int *addr;
  double *pdVar2;
  double *pdVar3;
  double *x;
  int iVar4;
  int n;
  char equed [1];
  int m;
  int_t lwork;
  void *local_338;
  FILE *local_330;
  int *local_328;
  int_t info;
  double *local_318;
  double *local_310;
  mem_usage_t mem_usage;
  int_t nnz;
  int *local_2f8;
  double rcond;
  double rpg;
  double *local_2e0;
  size_t local_2d8;
  double *local_2d0;
  double *local_2c8;
  double *local_2c0;
  trans_t trans;
  yes_no_t equil;
  SuperMatrix A;
  SuperMatrix B;
  SuperLUStat_t stat;
  double u;
  int_t *xa;
  int_t *asub;
  double *a;
  SuperMatrix X;
  SuperMatrix U;
  SuperMatrix L;
  superlu_options_t options;
  GlobalLU_t Glu;
  
  local_330 = _stdin;
  lwork = 0;
  equil = YES;
  u = 1.0;
  trans = NOTRANS;
  set_default_options(&options);
  parse_command_line(argc,argv,&lwork,&u,&equil,&trans);
  options.Equil = equil;
  options.DiagPivotThresh = u;
  local_328 = (int *)CONCAT44(local_328._4_4_,trans);
  options.Trans = trans;
  local_2d8 = (size_t)lwork;
  if ((long)local_2d8 < 1) {
    local_338 = (void *)0x0;
  }
  else {
    local_338 = superlu_malloc(local_2d8);
    if (local_338 == (void *)0x0) {
      local_338 = (void *)0x0;
      sprintf((char *)&Glu,"%s at line %d in file %s\n","DLINSOLX: cannot allocate work[]",0x6b,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
             );
      superlu_abort_and_exit((char *)&Glu);
    }
  }
  dreadhb(local_330,&m,&n,&nnz,&a,&asub,&xa);
  dCreate_CompCol_Matrix(&A,m,n,nnz,a,asub,xa,SLU_NC,SLU_D,SLU_GE);
  printf("Dimension %dx%d; # nonzeros %d\n",(ulong)(uint)A.nrow,(ulong)(uint)A.ncol,(ulong)*A.Store)
  ;
  pdVar2 = doubleMalloc((long)m);
  if (pdVar2 == (double *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for rhsb[].",0x76,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  pdVar3 = doubleMalloc((long)m);
  if (pdVar3 == (double *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for rhsx[].",0x77,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  dCreate_Dense_Matrix(&B,m,1,pdVar2,m,SLU_DN,SLU_D,SLU_GE);
  dCreate_Dense_Matrix(&X,m,1,pdVar3,m,SLU_DN,SLU_D,SLU_GE);
  x = doubleMalloc((long)n);
  iVar4 = n;
  dGenXtrue(n,1,x,n);
  local_2d0 = x;
  dFillRHS((trans_t)local_328,1,x,iVar4,&A,&B);
  local_2f8 = int32Malloc(n);
  if (local_2f8 == (int *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for etree[].",0x7f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  local_328 = int32Malloc(m);
  if (local_328 == (int *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for perm_r[].",0x80,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  local_2c0 = pdVar2;
  local_330 = (FILE *)int32Malloc(n);
  if (local_330 == (FILE *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","Malloc fails for perm_c[].",0x81,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  local_310 = (double *)superlu_malloc((long)A.nrow << 3);
  if (local_310 == (double *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for R[].",0x83,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  local_318 = (double *)superlu_malloc((long)A.ncol << 3);
  if (local_318 == (double *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for C[].",0x85,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  local_2e0 = (double *)superlu_malloc(8);
  if (local_2e0 == (double *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ferr[].",0x87,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  local_2c8 = pdVar3;
  pdVar2 = (double *)superlu_malloc(8);
  if (pdVar2 == (double *)0x0) {
    sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for berr[].",0x89,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/dlinsolx1.c"
           );
    superlu_abort_and_exit((char *)&Glu);
  }
  StatInit(&stat);
  pdVar3 = local_2e0;
  B.ncol = 0;
  iVar4 = (int)local_2d8;
  dgssvx(&options,&A,&local_330->_flags,local_328,local_2f8,equed,local_310,local_318,&L,&U,
         local_338,iVar4,&B,&X,&rpg,&rcond,local_2e0,pdVar2,&Glu,&mem_usage,&stat,&info);
  printf("LU factorization: dgssvx() returns info %lld\n",(long)info);
  if ((ulong)(uint)info == 0) {
LAB_00101a66:
    if (options.PivotGrowth != NO) {
      printf("Recip. pivot growth = %e\n",rpg);
    }
    if (options.ConditionNumber != NO) {
      printf("Recip. condition number = %e\n",rcond);
    }
    printf("No of nonzeros in factor L = %lld\n",(long)*L.Store);
    printf("No of nonzeros in factor U = %lld\n",(long)*U.Store);
    printf("No of nonzeros in L+U = %lld\n",((long)*U.Store + (long)*L.Store) - (long)n);
    printf("FILL ratio = %.1f\n",(double)((float)((*U.Store + *L.Store) - n) / (float)nnz));
    printf("L\\U MB %.3f\ttotal MB needed %.3f\n",(double)mem_usage.for_lu / 1000000.0,
           (double)mem_usage.total_needed / 1000000.0);
    fflush(_stdout);
  }
  else {
    if (info == n + 1) goto LAB_00101a66;
    if (iVar4 == -1 && 0 < info) {
      printf("** Estimated memory: %lld bytes\n",(ulong)(uint)info - (long)n);
    }
  }
  if (options.PrintStat != NO) {
    StatPrint(&stat);
  }
  StatFree(&stat);
  options.Fact = FACTORED;
  B.ncol = 1;
  StatInit(&stat);
  addr = local_2f8;
  iVar1 = lwork;
  dgssvx(&options,&A,&local_330->_flags,local_328,local_2f8,equed,local_310,local_318,&L,&U,
         local_338,lwork,&B,&X,&rpg,&rcond,pdVar3,pdVar2,&Glu,&mem_usage,&stat,&info);
  printf("Triangular solve: dgssvx() returns info %lld\n",(long)info);
  if ((ulong)(uint)info != 0) {
    if (info != n + 1) {
      if (iVar1 == -1 && 0 < info) {
        printf("** Estimated memory: %lld bytes\n",(ulong)(uint)info - (long)n);
      }
      goto LAB_00101cdc;
    }
  }
  if (options.IterRefine != NOREFINE) {
    puts("Iterative Refinement:");
    printf("%8s%8s%16s%16s\n","rhs","Steps","FERR","BERR");
    printf("%8d%8d%16e%16e\n",*pdVar3,*pdVar2,1,(ulong)(uint)stat.RefineSteps);
  }
  fflush(_stdout);
LAB_00101cdc:
  if (options.PrintStat != NO) {
    StatPrint(&stat);
  }
  StatFree(&stat);
  superlu_free(local_2c0);
  superlu_free(local_2c8);
  superlu_free(local_2d0);
  superlu_free(addr);
  superlu_free(local_328);
  superlu_free(local_330);
  superlu_free(local_310);
  superlu_free(local_318);
  superlu_free(pdVar3);
  superlu_free(pdVar2);
  Destroy_CompCol_Matrix(&A);
  Destroy_SuperMatrix_Store(&B);
  Destroy_SuperMatrix_Store(&X);
  if (iVar1 == 0) {
    Destroy_SuperNode_Matrix(&L);
    Destroy_CompCol_Matrix(&U);
  }
  else if (0 < iVar1) {
    superlu_free(local_338);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
/*!
 * \brief The driver program DLINSOLX1.
 *
 * This example illustrates how to use DGSSVX to solve systems with the same
 * A but different right-hand side.
 * In this case, we factorize A only once in the first call to DGSSVX,
 * and reuse the following data structures in the subsequent call to DGSSVX:
 *     perm_c, perm_r, R, C, L, U.
 * 
 */
    char           equed[1];
    yes_no_t       equil;
    trans_t        trans;
    SuperMatrix    A, L, U;
    SuperMatrix    B, X;
    NCformat       *Astore;
    NCformat       *Ustore;
    SCformat       *Lstore;
    GlobalLU_t	   Glu; /* facilitate multiple factorizations with 
                           SamePattern_SameRowPerm                  */
    double         *a;
    int_t          *asub, *xa;
    int            *perm_c; /* column permutation vector */
    int            *perm_r; /* row permutations from partial pivoting */
    int            *etree;
    void           *work = NULL;
    int            m, n, nrhs, ldx;
    int_t          info, lwork, nnz;
    double         *rhsb, *rhsx, *xact;
    double         *R, *C;
    double         *ferr, *berr;
    double         u, rpg, rcond;
    mem_usage_t    mem_usage;
    superlu_options_t options;
    SuperLUStat_t stat;
    FILE           *fp = stdin;

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter main()");
#endif

    /* Defaults */
    lwork = 0;
    nrhs  = 1;
    equil = YES;	
    u     = 1.0;
    trans = NOTRANS;

    /* Set the default values for options argument:
	options.Fact = DOFACT;
        options.Equil = YES;
    	options.ColPerm = COLAMD;
	options.DiagPivotThresh = 1.0;
    	options.Trans = NOTRANS;
    	options.IterRefine = NOREFINE;
    	options.SymmetricMode = NO;
    	options.PivotGrowth = NO;
    	options.ConditionNumber = NO;
    	options.PrintStat = YES;
    */
    set_default_options(&options);

    /* Can use command line input to modify the defaults. */
    parse_command_line(argc, argv, &lwork, &u, &equil, &trans);
    options.Equil = equil;
    options.DiagPivotThresh = u;
    options.Trans = trans;
    
    if ( lwork > 0 ) {
	work = SUPERLU_MALLOC(lwork);
	if ( !work ) {
	    ABORT("DLINSOLX: cannot allocate work[]");
	}
    }

    /* Read matrix A from a file in Harwell-Boeing format.*/
    dreadhb(fp, &m, &n, &nnz, &a, &asub, &xa);
    
    dCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa, SLU_NC, SLU_D, SLU_GE);
    Astore = A.Store;
    printf("Dimension %dx%d; # nonzeros %d\n", (int)A.nrow, (int)A.ncol, (int)Astore->nnz);
    
    if ( !(rhsb = doubleMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsb[].");
    if ( !(rhsx = doubleMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsx[].");
    dCreate_Dense_Matrix(&B, m, nrhs, rhsb, m, SLU_DN, SLU_D, SLU_GE);
    dCreate_Dense_Matrix(&X, m, nrhs, rhsx, m, SLU_DN, SLU_D, SLU_GE);
    xact = doubleMalloc(n * nrhs);
    ldx = n;
    dGenXtrue(n, nrhs, xact, ldx);
    dFillRHS(trans, nrhs, xact, ldx, &A, &B);
    
    if ( !(etree = int32Malloc(n)) ) ABORT("Malloc fails for etree[].");
    if ( !(perm_r = int32Malloc(m)) ) ABORT("Malloc fails for perm_r[].");
    if ( !(perm_c = int32Malloc(n)) ) ABORT("Malloc fails for perm_c[].");
    if ( !(R = (double *) SUPERLU_MALLOC(A.nrow * sizeof(double))) ) 
        ABORT("SUPERLU_MALLOC fails for R[].");
    if ( !(C = (double *) SUPERLU_MALLOC(A.ncol * sizeof(double))) )
        ABORT("SUPERLU_MALLOC fails for C[].");
    if ( !(ferr = (double *) SUPERLU_MALLOC(nrhs * sizeof(double))) )
        ABORT("SUPERLU_MALLOC fails for ferr[].");
    if ( !(berr = (double *) SUPERLU_MALLOC(nrhs * sizeof(double))) ) 
        ABORT("SUPERLU_MALLOC fails for berr[].");

    /* Initialize the statistics variables. */
    StatInit(&stat);
    
    /* ONLY PERFORM THE LU DECOMPOSITION */
    B.ncol = 0;  /* Indicate not to solve the system */
    dgssvx(&options, &A, perm_c, perm_r, etree, equed, R, C,
           &L, &U, work, lwork, &B, &X, &rpg, &rcond, ferr, berr,
           &Glu, &mem_usage, &stat, &info);

    printf("LU factorization: dgssvx() returns info %lld\n", (long long)info);

    if ( info == 0 || info == n+1 ) {

	if ( options.PivotGrowth ) printf("Recip. pivot growth = %e\n", rpg);
	if ( options.ConditionNumber )
	    printf("Recip. condition number = %e\n", rcond);
        Lstore = (SCformat *) L.Store;
        Ustore = (NCformat *) U.Store;
	printf("No of nonzeros in factor L = %lld\n", (long long) Lstore->nnz);
    	printf("No of nonzeros in factor U = %lld\n", (long long) Ustore->nnz);
    	printf("No of nonzeros in L+U = %lld\n", (long long) Lstore->nnz + Ustore->nnz - n);
    	printf("FILL ratio = %.1f\n", (float)(Lstore->nnz + Ustore->nnz - n)/nnz);

	printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
	       mem_usage.for_lu/1e6, mem_usage.total_needed/1e6);
	fflush(stdout);

    } else if ( info > 0 && lwork == -1 ) {
        printf("** Estimated memory: %lld bytes\n", (long long)info - n);
    }

    if ( options.PrintStat ) StatPrint(&stat);
    StatFree(&stat);

    /* ------------------------------------------------------------
       NOW WE SOLVE THE LINEAR SYSTEM USING THE FACTORED FORM OF A.
       ------------------------------------------------------------*/
    options.Fact = FACTORED; /* Indicate the factored form of A is supplied. */
    B.ncol = nrhs;  /* Set the number of right-hand side */

    /* Initialize the statistics variables. */
    StatInit(&stat);

    dgssvx(&options, &A, perm_c, perm_r, etree, equed, R, C,
           &L, &U, work, lwork, &B, &X, &rpg, &rcond, ferr, berr,
           &Glu, &mem_usage, &stat, &info);

    printf("Triangular solve: dgssvx() returns info %lld\n", (long long)info);

    if ( info == 0 || info == n+1 ) {

        /* This is how you could access the solution matrix. */
        double *sol = (double*) ((DNformat*) X.Store)->nzval; 
        (void)sol;  // suppress unused variable warning

	if ( options.IterRefine ) {
            printf("Iterative Refinement:\n");
	    printf("%8s%8s%16s%16s\n", "rhs", "Steps", "FERR", "BERR");
	    for (int i = 0; i < nrhs; ++i)
	      printf("%8d%8d%16e%16e\n", i+1, stat.RefineSteps, ferr[i], berr[i]);
	}
	fflush(stdout);
    } else if ( info > 0 && lwork == -1 ) {
        printf("** Estimated memory: %lld bytes\n", (long long)info - n);
    }

    if ( options.PrintStat ) StatPrint(&stat);
    StatFree(&stat);

    SUPERLU_FREE (rhsb);
    SUPERLU_FREE (rhsx);
    SUPERLU_FREE (xact);
    SUPERLU_FREE (etree);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    SUPERLU_FREE (R);
    SUPERLU_FREE (C);
    SUPERLU_FREE (ferr);
    SUPERLU_FREE (berr);
    Destroy_CompCol_Matrix(&A);
    Destroy_SuperMatrix_Store(&B);
    Destroy_SuperMatrix_Store(&X);
    if ( lwork == 0 ) {
        Destroy_SuperNode_Matrix(&L);
        Destroy_CompCol_Matrix(&U);
    } else if ( lwork > 0 ) {
        SUPERLU_FREE(work);
    }


#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit main()");
#endif
    return EXIT_SUCCESS;
}